

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O2

QSize __thiscall QtMWidgets::TextLabel::minimumSizeHint(TextLabel *this)

{
  int iVar1;
  int iVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  QTextDocument doc;
  QArrayDataPointer<char16_t> local_70;
  QTextDocument local_58 [16];
  QSize local_48;
  undefined8 uStack_40;
  double local_38;
  
  text((QString *)&local_70,this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  if (local_70.size == 0) {
    iVar1 = QFrame::frameWidth();
    iVar2 = QFrame::frameWidth();
    local_48.ht = iVar2 * 2;
    local_48.wd = iVar1 * 2;
  }
  else {
    auVar4 = QWidget::contentsMargins();
    QTextDocument::QTextDocument(local_58,(QObject *)0x0);
    QStaticText::text();
    QTextDocument::setHtml((QString *)local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QStaticText::textOption();
    QTextDocument::setDefaultTextOption((QTextOption *)local_58);
    QTextOption::~QTextOption((QTextOption *)&local_70);
    QWidget::fontMetrics((QWidget *)&local_70);
    iVar1 = QFontMetrics::averageCharWidth();
    QTextDocument::setTextWidth((double)(iVar1 * 10));
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_70);
    auVar5 = QTextDocument::size();
    local_38 = auVar5._8_8_;
    local_48 = auVar5._0_8_;
    iVar1 = QFrame::frameWidth();
    dVar3 = (double)(((this->d).d)->margin * 2);
    local_48.wd = (int)(dVar3 + (double)auVar4._8_4_ +
                                (double)auVar4._0_4_ + (double)(iVar1 * 2) + (double)local_48);
    local_48.ht = (int)(dVar3 + (double)auVar4._12_4_ +
                                (double)auVar4._4_4_ + (double)(iVar1 * 2) + local_38);
    uStack_40 = 0;
    QTextDocument::~QTextDocument(local_58);
  }
  return local_48;
}

Assistant:

QSize
TextLabel::minimumSizeHint() const
{
	if( text().isEmpty() )
		return QSize( 2 * frameWidth(), 2 * frameWidth() );

	const QMargins margins = contentsMargins();

	QTextDocument doc;
	doc.setHtml( d->staticText.text() );
	doc.setDefaultTextOption( d->staticText.textOption() );
	doc.setTextWidth( fontMetrics().averageCharWidth() * 10 );

	const QSizeF size = doc.size();
	const int frame = 2 * frameWidth();

	return QSize( size.width() + frame + margins.left() + margins.right() +
		2 * d->margin,
		size.height() + frame + margins.top() + margins.bottom() +
		2 * d->margin );
}